

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequential_attribute_decoders_controller.cc
# Opt level: O3

bool __thiscall
draco::SequentialAttributeDecodersController::DecodeDataNeededByPortableTransforms
          (SequentialAttributeDecodersController *this,DecoderBuffer *in_buffer)

{
  __uniq_ptr_impl<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>
  _Var1;
  ulong uVar2;
  char cVar3;
  uint uVar4;
  ulong uVar5;
  bool bVar6;
  
  uVar4 = (*(this->super_AttributesDecoder).super_AttributesDecoderInterface.
            _vptr_AttributesDecoderInterface[6])();
  if ((int)uVar4 < 1) {
    bVar6 = true;
  }
  else {
    _Var1._M_t.
    super__Tuple_impl<0UL,_draco::SequentialAttributeDecoder_*,_std::default_delete<draco::SequentialAttributeDecoder>_>
    .super__Head_base<0UL,_draco::SequentialAttributeDecoder_*,_false>._M_head_impl =
         (((this->sequential_decoders_).
           super__Vector_base<std::unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>,_std::allocator<std::unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_t).
         super___uniq_ptr_impl<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>
         ._M_t;
    cVar3 = (**(code **)(*(long *)_Var1._M_t.
                                  super__Tuple_impl<0UL,_draco::SequentialAttributeDecoder_*,_std::default_delete<draco::SequentialAttributeDecoder>_>
                                  .super__Head_base<0UL,_draco::SequentialAttributeDecoder_*,_false>
                                  ._M_head_impl + 0x28))
                      (_Var1._M_t.
                       super__Tuple_impl<0UL,_draco::SequentialAttributeDecoder_*,_std::default_delete<draco::SequentialAttributeDecoder>_>
                       .super__Head_base<0UL,_draco::SequentialAttributeDecoder_*,_false>.
                       _M_head_impl,&this->point_ids_,in_buffer);
    if (cVar3 == '\0') {
      bVar6 = false;
    }
    else {
      uVar2 = 1;
      do {
        uVar5 = uVar2;
        if (uVar4 == uVar5) break;
        _Var1._M_t.
        super__Tuple_impl<0UL,_draco::SequentialAttributeDecoder_*,_std::default_delete<draco::SequentialAttributeDecoder>_>
        .super__Head_base<0UL,_draco::SequentialAttributeDecoder_*,_false>._M_head_impl =
             (this->sequential_decoders_).
             super__Vector_base<std::unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>,_std::allocator<std::unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar5]._M_t.
             super___uniq_ptr_impl<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>
             ._M_t;
        cVar3 = (**(code **)(*(long *)_Var1._M_t.
                                      super__Tuple_impl<0UL,_draco::SequentialAttributeDecoder_*,_std::default_delete<draco::SequentialAttributeDecoder>_>
                                      .
                                      super__Head_base<0UL,_draco::SequentialAttributeDecoder_*,_false>
                                      ._M_head_impl + 0x28))
                          (_Var1._M_t.
                           super__Tuple_impl<0UL,_draco::SequentialAttributeDecoder_*,_std::default_delete<draco::SequentialAttributeDecoder>_>
                           .super__Head_base<0UL,_draco::SequentialAttributeDecoder_*,_false>.
                           _M_head_impl,&this->point_ids_,in_buffer);
        uVar2 = uVar5 + 1;
      } while (cVar3 != '\0');
      bVar6 = uVar4 <= uVar5;
    }
  }
  return bVar6;
}

Assistant:

bool SequentialAttributeDecodersController::
    DecodeDataNeededByPortableTransforms(DecoderBuffer *in_buffer) {
  const int32_t num_attributes = GetNumAttributes();
  for (int i = 0; i < num_attributes; ++i) {
    if (!sequential_decoders_[i]->DecodeDataNeededByPortableTransform(
            point_ids_, in_buffer)) {
      return false;
    }
  }
  return true;
}